

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O1

void __thiscall Neuron_testConnectTo_Test::TestBody(Neuron_testConnectTo_Test *this)

{
  bool bVar1;
  Connections *pCVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  Neuron n1;
  Neuron n2;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  AssertHelper local_100;
  internal local_f8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  Neuron local_e8;
  Neuron local_78;
  
  Neuron::Neuron(&local_e8,10.0,1.0,50.0);
  Neuron::Neuron(&local_78,10.0,1.0,50.0);
  local_100.data_._0_4_ = 0;
  pCVar2 = Neuron::connections(&local_e8);
  local_108.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)(pCVar2->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pCVar2->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_f8,"0","n1.connections().size()",(int *)&local_100,(unsigned_long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_108.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_108.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_108.ptr_ + 8))();
      }
      local_108.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Neuron::connectTo(&local_e8,&local_78,50.0);
  local_100.data_._0_4_ = 1;
  pCVar2 = Neuron::connections(&local_e8);
  local_108.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)(pCVar2->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pCVar2->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_f8,"1","n1.connections().size()",(int *)&local_100,(unsigned_long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_108.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_108.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_108.ptr_ + 8))();
      }
      local_108.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_100.data_._0_4_ = 0;
  pCVar2 = Neuron::connections(&local_78);
  local_108.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)(pCVar2->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pCVar2->super__Vector_base<Connection,_std::allocator<Connection>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_f8,"0","n2.connections().size()",(int *)&local_100,(unsigned_long *)&local_108);
  if (local_f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (local_f0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_f0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    if (local_108.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_108.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_108.ptr_ + 8))();
      }
      local_108.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
  ::~vector(&local_78.m_watchFor);
  if (local_78.m_incomingSpikes.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_incomingSpikes.
                    super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.m_connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.m_connections.
                    super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
  ::~vector(&local_e8.m_watchFor);
  if (local_e8.m_incomingSpikes.super__Vector_base<Connection_*,_std::allocator<Connection_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_incomingSpikes.
                    super__Vector_base<Connection_*,_std::allocator<Connection_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e8.m_connections.super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_connections.
                    super__Vector_base<Connection,_std::allocator<Connection>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Neuron, testConnectTo)
{
    Neuron n1;
    Neuron n2;

    EXPECT_EQ(0, n1.connections().size());

    n1.connectTo(&n2, 50.0f);

    EXPECT_EQ(1, n1.connections().size());
    EXPECT_EQ(0, n2.connections().size());
}